

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XercesNodeTest::XercesNodeTest
          (XercesNodeTest *this,XMLCh *prefix,uint uriId,MemoryManager *manager)

{
  QName *this_00;
  MemoryManager *manager_local;
  uint uriId_local;
  XMLCh *prefix_local;
  XercesNodeTest *this_local;
  
  XSerializable::XSerializable(&this->super_XSerializable);
  XMemory::XMemory((XMemory *)this);
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XercesNodeTest_00536558;
  this->fType = 4;
  this_00 = (QName *)XMemory::operator_new(0x48,manager);
  QName::QName(this_00,manager);
  this->fName = this_00;
  QName::setURI(this->fName,uriId);
  QName::setPrefix(this->fName,prefix);
  return;
}

Assistant:

XercesNodeTest::XercesNodeTest(const XMLCh* const prefix,
                               const unsigned int uriId,
                               MemoryManager* const manager)
    : fType(NodeType_NAMESPACE)
    , fName(new (manager) QName(manager))
{
    fName->setURI(uriId);
    fName->setPrefix(prefix);
}